

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

Options * __thiscall S2Builder::Options::operator=(Options *this,Options *options)

{
  pointer pSVar1;
  unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_> local_20;
  Options *local_18;
  Options *options_local;
  Options *this_local;
  
  local_18 = options;
  options_local = this;
  pSVar1 = std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::
           operator->(&options->snap_function_);
  (*pSVar1->_vptr_SnapFunction[6])(&local_20);
  std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::operator=
            (&this->snap_function_,&local_20);
  std::unique_ptr<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>::
  ~unique_ptr(&local_20);
  this->split_crossing_edges_ = (bool)(local_18->split_crossing_edges_ & 1);
  this->simplify_edge_chains_ = (bool)(local_18->simplify_edge_chains_ & 1);
  this->idempotent_ = (bool)(local_18->idempotent_ & 1);
  return this;
}

Assistant:

S2Builder::Options& S2Builder::Options::operator=(const Options& options) {
  snap_function_ = options.snap_function_->Clone();
  split_crossing_edges_ = options.split_crossing_edges_;
  simplify_edge_chains_ = options.simplify_edge_chains_;
  idempotent_ = options.idempotent_;
  return *this;
}